

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint16_t FACTCue_GetVariableIndex(FACTCue *pCue,char *szFriendlyName)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint16_t i;
  ushort local_1a;
  
  if (in_RDI != (undefined8 *)0x0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x116b99);
    for (local_1a = 0; local_1a < *(ushort *)(*(long *)*in_RDI + 0x22); local_1a = local_1a + 1) {
      iVar1 = SDL_strcmp(in_RSI,*(undefined8 *)
                                 (*(long *)(*(long *)*in_RDI + 0x38) + (ulong)local_1a * 8));
      if ((iVar1 == 0) &&
         ((*(byte *)(*(long *)(*(long *)*in_RDI + 0x58) + (ulong)local_1a * 0x10) & 4) != 0)) {
        FAudio_PlatformUnlockMutex((FAudioMutex)0x116c20);
        return local_1a;
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x116c57);
  }
  return 0xffff;
}

Assistant:

uint16_t FACTCue_GetVariableIndex(
	FACTCue *pCue,
	const char *szFriendlyName
) {
	uint16_t i;
	if (pCue == NULL)
	{
		return FACTVARIABLEINDEX_INVALID;
	}
	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
	for (i = 0; i < pCue->parentBank->parentEngine->variableCount; i += 1)
	{
		if (	FAudio_strcmp(szFriendlyName, pCue->parentBank->parentEngine->variableNames[i]) == 0 &&
			pCue->parentBank->parentEngine->variables[i].accessibility & 0x04	)
		{
			FAudio_PlatformUnlockMutex(
				pCue->parentBank->parentEngine->apiLock
			);
			return i;
		}
	}
	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return FACTVARIABLEINDEX_INVALID;
}